

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetClient.cpp
# Opt level: O2

VRDataQueue * __thiscall
MinVR::VRNetClient::syncEventDataAcrossAllNodes
          (VRDataQueue *__return_storage_ptr__,VRNetClient *this,VRDataQueue *eventQueue)

{
  int socketID;
  int socketID_00;
  serialData allEventData;
  serialData local_80;
  serialData local_60;
  serialData local_40;
  
  socketID = this->_socketFD;
  VRDataQueue::serialize_abi_cxx11_(&local_40,eventQueue);
  VRNetInterface::sendEventData(socketID,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  VRNetInterface::waitForAndReceiveEventData_abi_cxx11_
            (&local_60,(VRNetInterface *)(ulong)(uint)this->_socketFD,socketID_00);
  std::__cxx11::string::string((string *)&local_80,(string *)&local_60);
  VRDataQueue::VRDataQueue(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

VRDataQueue VRNetClient::syncEventDataAcrossAllNodes(VRDataQueue eventQueue) {

  // 1. send inputEvents to server
  sendEventData(_socketFD, eventQueue.serialize());

  // 2. receive all events from the server
  VRDataQueue::serialData allEventData = waitForAndReceiveEventData(_socketFD);

  return VRDataQueue(allEventData);
}